

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_mask_sy_w4_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint in_ESI;
  long lVar1;
  void *in_RDI;
  long in_R8;
  uint in_R9D;
  __m128i *extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  __m128i *extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  __m128i alVar2;
  void *in_stack_00000008;
  __m128i v_res_b;
  __m128i v_m1_b;
  __m128i v_m0_b;
  __m128i v_rb_b;
  __m128i v_ra_b;
  __m128i _r;
  __m128i v_maxval_b;
  __m128i *rounding;
  __m128i *v_m1_b_00;
  __m128i *v_m0_b_00;
  uint8_t *src1_00;
  uint8_t *src0_00;
  undefined8 local_b8;
  undefined8 local_98;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 local_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  
  src0_00 = (uint8_t *)0x4040404040404040;
  v_m0_b_00 = (__m128i *)0x200020002000200;
  src1_00 = (uint8_t *)0x200020002000200;
  local_b8 = in_R8;
  local_98 = in_RDI;
  do {
    xx_loadl_32(in_stack_00000008);
    rounding = extraout_XMM0_Qa;
    v_m1_b_00 = extraout_XMM0_Qb;
    xx_loadl_32((void *)((long)in_stack_00000008 + (ulong)(uint)v_res_b[0]));
    local_38 = SUB81(rounding,0);
    uStack_37 = (undefined1)((ulong)rounding >> 8);
    uStack_36 = (undefined1)((ulong)rounding >> 0x10);
    uStack_35 = (undefined1)((ulong)rounding >> 0x18);
    uStack_34 = (undefined1)((ulong)rounding >> 0x20);
    uStack_33 = (undefined1)((ulong)rounding >> 0x28);
    uStack_32 = (undefined1)((ulong)rounding >> 0x30);
    uStack_31 = (undefined1)((ulong)rounding >> 0x38);
    uStack_30 = SUB81(v_m1_b_00,0);
    uStack_2f = (undefined1)((ulong)v_m1_b_00 >> 8);
    uStack_2e = (undefined1)((ulong)v_m1_b_00 >> 0x10);
    uStack_2d = (undefined1)((ulong)v_m1_b_00 >> 0x18);
    uStack_2c = (undefined1)((ulong)v_m1_b_00 >> 0x20);
    uStack_2b = (undefined1)((ulong)v_m1_b_00 >> 0x28);
    uStack_2a = (undefined1)((ulong)v_m1_b_00 >> 0x30);
    uStack_29 = (undefined1)((ulong)v_m1_b_00 >> 0x38);
    local_48 = (undefined1)extraout_XMM0_Qa_00;
    uStack_47 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 8);
    uStack_46 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x10);
    uStack_45 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x18);
    uStack_44 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    uStack_43 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x28);
    uStack_42 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x30);
    uStack_41 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x38);
    uStack_40 = (undefined1)extraout_XMM0_Qb_00;
    uStack_3f = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 8);
    uStack_3e = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x10);
    uStack_3d = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x18);
    uStack_3c = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x20);
    uStack_3b = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x28);
    uStack_3a = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x30);
    uStack_39 = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x38);
    pavgb(local_38,local_48);
    pavgb(uStack_37,uStack_47);
    pavgb(uStack_36,uStack_46);
    pavgb(uStack_35,uStack_45);
    pavgb(uStack_34,uStack_44);
    pavgb(uStack_33,uStack_43);
    pavgb(uStack_32,uStack_42);
    pavgb(uStack_31,uStack_41);
    pavgb(uStack_30,uStack_40);
    pavgb(uStack_2f,uStack_3f);
    pavgb(uStack_2e,uStack_3e);
    pavgb(uStack_2d,uStack_3d);
    pavgb(uStack_2c,uStack_3c);
    pavgb(uStack_2b,uStack_3b);
    pavgb(uStack_2a,uStack_3a);
    pavgb(uStack_29,uStack_39);
    lVar1 = local_b8;
    alVar2 = blend_4_u8(src0_00,src1_00,v_m0_b_00,v_m1_b_00,rounding);
    alVar2[0] = lVar1;
    xx_storel_32(local_98,alVar2);
    local_98 = (void *)((long)local_98 + (ulong)in_ESI);
    local_b8 = local_b8 + (ulong)in_R9D;
    in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)((uint)v_res_b[0] << 1));
    v_m1_b[0]._0_4_ = (int)v_m1_b[0] + -1;
  } while ((int)v_m1_b[0] != 0);
  return;
}

Assistant:

static void blend_a64_mask_sy_w4_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  (void)w;

  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));

  do {
    const __m128i v_ra_b = xx_loadl_32(mask);
    const __m128i v_rb_b = xx_loadl_32(mask + mask_stride);
    const __m128i v_m0_b = _mm_avg_epu8(v_ra_b, v_rb_b);
    const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

    const __m128i v_res_b = blend_4_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

    xx_storel_32(dst, v_res_b);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}